

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

int minimalSwapAndFlipIVar_superFast_all_noEBFC
              (word *pInOut,int nVars,int nWords,int *pStore,char *pCanonPerm,uint *pCanonPhase)

{
  int iVar1;
  long lVar2;
  int iVar4;
  word pDuplicate [1024];
  long lVar3;
  
  iVar1 = *pStore;
  memcpy(pDuplicate,pInOut,(long)nWords << 3);
  lVar2 = 0;
  while (iVar4 = iVar1, lVar3 = lVar2, lVar2 = lVar3 + 1, lVar2 != 6) {
    iVar1 = pStore[lVar2];
    if (iVar4 == pStore[lVar2]) {
      minimalSwapAndFlipIVar_superFast_lessThen5_noEBFC
                (pInOut,(int)lVar3,nWords,pCanonPerm,pCanonPhase);
      iVar1 = iVar4;
    }
  }
  iVar1 = pStore[6];
  if (iVar4 == pStore[6]) {
    minimalSwapAndFlipIVar_superFast_iVar5_noEBFC((uint *)pInOut,nWords,pCanonPerm,pCanonPhase);
    iVar1 = iVar4;
  }
  lVar2 = 6;
  while (lVar2 < nVars + -1) {
    lVar3 = lVar2 + 1;
    if (iVar1 == pStore[lVar3]) {
      minimalSwapAndFlipIVar_superFast_moreThen5_noEBFC
                (pInOut,(int)lVar2,nWords,pCanonPerm,pCanonPhase);
      lVar2 = lVar2 + 1;
    }
    else {
      lVar2 = lVar2 + 1;
      iVar1 = pStore[lVar3];
    }
  }
  iVar1 = bcmp(pInOut,pDuplicate,(long)nWords << 3);
  return (int)(iVar1 != 0);
}

Assistant:

int minimalSwapAndFlipIVar_superFast_all_noEBFC(word* pInOut, int nVars, int nWords, int * pStore, char * pCanonPerm, unsigned* pCanonPhase)
{
    int i;
    word pDuplicate[1024];  
    int bitInfoTemp = pStore[0];
    memcpy(pDuplicate,pInOut,nWords*sizeof(word));
    for(i=0;i<5;i++)
    {
        if(bitInfoTemp == pStore[i+1])
            minimalSwapAndFlipIVar_superFast_lessThen5_noEBFC(pInOut, i, nWords, pCanonPerm, pCanonPhase);
        else
        {
            bitInfoTemp = pStore[i+1];
            continue;
        }
    }
    if(bitInfoTemp == pStore[i+1])
        minimalSwapAndFlipIVar_superFast_iVar5_noEBFC((unsigned*) pInOut, nWords, pCanonPerm, pCanonPhase);
    else    
        bitInfoTemp = pStore[i+1];
    
    for(i=6;i<nVars-1;i++)
    {
        if(bitInfoTemp == pStore[i+1])
            minimalSwapAndFlipIVar_superFast_moreThen5_noEBFC(pInOut, i, nWords, pCanonPerm, pCanonPhase);
        else
        {
            bitInfoTemp = pStore[i+1];
            continue;
        }
    }
    if(memcmp(pInOut,pDuplicate , nWords*sizeof(word)) == 0)
        return 0;
    else
        return 1;
}